

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int spyParamTest(void)

{
  Hook *pHVar1;
  Hook *fooHook;
  HookArena arena;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  HookArena *in_stack_ffffffffffffffc0;
  HookArena *in_stack_ffffffffffffffc8;
  
  axl::spy::HookArena::HookArena(in_stack_ffffffffffffffc0);
  pHVar1 = axl::spy::HookArena::allocate
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (HookEnterFunc *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                      ,(HookLeaveFunc *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  uVar2 = 8;
  (*(code *)pHVar1)(0x4024333333333333,0x4034333333333333,0x403e4ccccccccccd,0x4044333333333333,
                    0x4049400000000000,0x404e4ccccccccccd,0x4051accccccccccd,0x4054333333333333,1,2,
                    3,4,5,6,7,8,9,0x4056b9999999999a);
  axl::spy::HookArena::~HookArena((HookArena *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
  return 0;
}

Assistant:

int
spyParamTest() {
	typedef int FooFunc(
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double,
		int, double
	);

	spy::HookArena arena;

	spy::Hook* fooHook = arena.allocate(
		(void*)spy_param_test::foo,
		(void*)0xabcdef,
		spy_param_test::fooHookEnter,
		spy_param_test::fooHookLeave
	);

	((FooFunc*)fooHook)(
		1, 10.1,
		2, 20.2,
		3, 30.3,
		4, 40.4,
		5, 50.5,
		6, 60.6,
		7, 70.7,
		8, 80.8,
		9, 90.9
	);

	return 0;
}